

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void qrdecomp(double *A,int M,int N,double *bvec)

{
  size_t __size;
  int n;
  double *x;
  double *v;
  double *A_00;
  double *C;
  ulong uVar1;
  long lVar2;
  double *pdVar3;
  int m;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  double alpha;
  
  if (N <= M) {
    lVar13 = (long)M;
    __size = lVar13 * 8;
    x = (double *)malloc(__size);
    v = (double *)malloc(__size);
    lVar14 = (long)N;
    A_00 = (double *)malloc(__size * lVar14);
    C = (double *)malloc(__size * lVar13);
    uVar9 = 0;
    uVar1 = 0;
    if (0 < N) {
      uVar1 = (ulong)(uint)N;
    }
    uVar5 = (ulong)(uint)M;
    uVar11 = (ulong)(uint)N;
    pdVar10 = A + lVar14;
    while( true ) {
      uVar8 = (uint)uVar9;
      n = M - uVar8;
      uVar12 = uVar8;
      if (n != 0 && (int)uVar8 <= M) {
        uVar12 = M;
      }
      if (uVar9 == uVar1) break;
      pdVar3 = A;
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        x[uVar4] = *pdVar3;
        pdVar3 = pdVar3 + lVar14;
      }
      alpha = house(x,M - uVar8,v);
      bvec[uVar9] = alpha;
      lVar2 = 0;
      pdVar3 = A;
      for (uVar4 = uVar9; uVar4 != uVar12; uVar4 = uVar4 + 1) {
        lVar6 = lVar2;
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          *(double *)((long)A_00 + (lVar6 >> 0x1d)) = pdVar3[uVar7];
          lVar6 = lVar6 + (uVar5 << 0x20);
        }
        pdVar3 = pdVar3 + lVar14;
        lVar2 = lVar2 + 0x100000000;
      }
      m = N - uVar8;
      mmult(A_00,v,C,m,n,1);
      scale(C,m,1,alpha);
      mmult(v,C,A_00,n,1,m);
      lVar2 = 0;
      pdVar3 = A;
      for (uVar4 = uVar9; uVar4 != uVar12; uVar4 = uVar4 + 1) {
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          pdVar3[uVar7] = pdVar3[uVar7] - A_00[(int)lVar2 + (int)uVar7];
        }
        pdVar3 = pdVar3 + lVar14;
        lVar2 = lVar2 + uVar11;
      }
      pdVar3 = pdVar10;
      for (lVar2 = 1; (long)(uVar9 + lVar2) < lVar13; lVar2 = lVar2 + 1) {
        *pdVar3 = v[lVar2];
        pdVar3 = pdVar3 + lVar14;
      }
      uVar9 = uVar9 + 1;
      uVar5 = uVar5 - 1;
      A = A + lVar14 + 1;
      uVar11 = uVar11 - 1;
      pdVar10 = pdVar10 + lVar14 + 1;
    }
    free(x);
    free(v);
    free(A_00);
    free(C);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void qrdecomp(double *A, int M, int N,double *bvec) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;
	
	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];
			
		}
		
		beta = house(x,M-j,v);
		bvec[j] = beta;
	
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);
				
			}
			
		}
		
		
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
		if (j < M) {
			for(i=j+1;i < M;++i) {
				A[i*N+j] = v[i-j];
			}
		}
		 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}